

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_long,double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,unsigned_long *t_lhs,
          unsigned_long *c_lhs,double *c_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  Boxed_Value BVar6;
  double local_10;
  
  switch(t_oper) {
  case equals:
    bVar3 = ((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0) == *c_rhs;
    break;
  case less_than:
    dVar5 = ((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0);
    bVar3 = *c_rhs == dVar5;
    bVar4 = *c_rhs < dVar5;
    goto LAB_002edbe1;
  case greater_than:
    dVar5 = ((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0);
    bVar3 = dVar5 == *c_rhs;
    bVar4 = dVar5 < *c_rhs;
LAB_002edbe1:
    bVar3 = !bVar4 && !bVar3;
    goto LAB_002edc53;
  case less_than_equal:
    bVar3 = *c_rhs < ((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0);
    goto LAB_002edb89;
  case greater_than_equal:
    bVar3 = ((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0) < *c_rhs;
LAB_002edb89:
    bVar3 = !bVar3;
    goto LAB_002edc53;
  case not_equal:
    bVar3 = ((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0) != *c_rhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      local_10 = ((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0) + *c_rhs;
      break;
    case quotient:
      local_10 = (((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0)) / *c_rhs;
      break;
    case product:
      local_10 = (((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0)) * *c_rhs;
      break;
    case difference:
      local_10 = (((double)CONCAT44(0x45300000,(int)(*c_lhs >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)*c_lhs) - 4503599627370496.0)) - *c_rhs;
      break;
    default:
      if (t_lhs == (unsigned_long *)0x0) {
switchD_002edae3_caseD_7:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__bad_cast_003c7d48;
        __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        dVar5 = *c_rhs;
        break;
      default:
        goto switchD_002edae3_caseD_7;
      case assign_product:
        dVar5 = (((double)CONCAT44(0x45300000,(int)(*t_lhs >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)*t_lhs) - 4503599627370496.0)) * *c_rhs;
        break;
      case assign_sum:
        dVar5 = ((double)CONCAT44(0x45300000,(int)(*t_lhs >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)*t_lhs) - 4503599627370496.0) + *c_rhs;
        break;
      case assign_quotient:
        dVar5 = (((double)CONCAT44(0x45300000,(int)(*t_lhs >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)*t_lhs) - 4503599627370496.0)) / *c_rhs;
        break;
      case assign_difference:
        dVar5 = (((double)CONCAT44(0x45300000,(int)(*t_lhs >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)*t_lhs) - 4503599627370496.0)) - *c_rhs;
      }
      *t_lhs = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      goto LAB_002edc58;
    }
    BVar6 = detail::const_var_impl<double>((detail *)this,&local_10);
    t_bv = BVar6.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    goto LAB_002edc58;
  }
  bVar3 = (bool)(-bVar3 & 1);
LAB_002edc53:
  BVar6 = const_var((chaiscript *)this,bVar3);
  t_bv = BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
LAB_002edc58:
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }